

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O1

Result * __thiscall
cppqc::
quickCheckOutput<std::array<bool,5ul>,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
          (Result *__return_storage_ptr__,cppqc *this,
          Property<std::array<bool,_5UL>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
          *prop,ostream *out,size_t maxSuccess,size_t maxDiscarded,size_t maxSize,
          duration<double,_std::ratio<1L,_1L>_> shrinkTimeout,SeedType seed)

{
  Result *pRVar1;
  multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  byte bVar2;
  char cVar3;
  size_t __i;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  ostream *numSuccess;
  char *pcVar9;
  multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  labels;
  Input in;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  labelsCollected;
  RngEngine rng;
  char local_14a9;
  undefined1 local_14a8 [32];
  _Base_ptr p_Stack_1488;
  size_t local_1480;
  Result *local_1478;
  SeedType local_1470;
  undefined4 local_146c;
  _Base_ptr local_1468;
  multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1460;
  ostream *local_1458;
  pointer local_1450;
  long local_1448;
  tuple<std::array<bool,_5UL>_> local_1440;
  undefined1 local_1438 [8];
  _Alloc_hider local_1430;
  char local_1420 [16];
  size_t local_1410;
  long local_1408;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_1400;
  char *local_13d0;
  duration<double,_std::ratio<1L,_1L>_> local_13c8;
  size_t local_13c0;
  char *local_13b8 [2];
  char local_13a8 [4976];
  undefined8 local_38;
  
  local_1478 = __return_storage_ptr__;
  local_1458 = out;
  local_13c8.__r = shrinkTimeout.__r;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,"* Checking property \"",0x15);
  (**(code **)(*(long *)this + 8))(local_13b8,this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)prop,local_13b8[0],(long)local_13b8[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" ...",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_13b8[0] != local_13a8) {
    operator_delete(local_13b8[0]);
  }
  poVar4 = local_1458;
  local_1410 = (long)local_1458 * 5;
  if (maxSuccess != 0) {
    local_1410 = maxSuccess;
  }
  local_13c0 = 100;
  if (maxDiscarded != 0) {
    local_13c0 = maxDiscarded;
  }
  local_1400._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1400._M_impl.super__Rb_tree_header._M_header;
  local_1400._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1400._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1400._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1400._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1400._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1470 = detail::resolveSeed((SeedType)maxSize);
  local_13d0 = (char *)(ulong)local_1470;
  lVar5 = 1;
  pcVar9 = local_13d0;
  do {
    pcVar9 = (char *)(ulong)(((uint)((ulong)pcVar9 >> 0x1e) ^ (uint)pcVar9) * 0x6c078965 +
                            (int)lVar5);
    local_13b8[lVar5] = pcVar9;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  local_38 = 0x270;
  local_1468 = &(local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1460 = &local_1478->labels;
  numSuccess = (ostream *)0x0;
  local_1448 = 0;
  local_1408 = 0;
  local_13b8[0] = local_13d0;
  while (numSuccess < poVar4) {
    uVar6 = ((long)numSuccess * local_13c0 + local_1448) / (ulong)poVar4;
    (**(code **)(**(long **)(this + 8) + 0x10))(&local_1440,*(long **)(this + 8),local_13b8,uVar6);
    local_146c = (**(code **)(*(long *)this + 0x30))(this,&local_1440);
    bVar2 = (**(code **)(*(long *)this + 0x20))(this,&local_1440);
    local_1408 = local_1408 + (ulong)bVar2;
    (**(code **)(*(long *)this + 0x28))((key_type *)local_14a8,this,&local_1440);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           *)&local_1400,(key_type *)local_14a8);
    *pmVar7 = *pmVar7 + 1;
    if ((undefined1 *)local_14a8._0_8_ != local_14a8 + 0x10) {
      operator_delete((void *)local_14a8._0_8_);
    }
    cVar3 = (char)local_146c;
    if (cVar3 == '\0') {
      bVar2 = (*(code *)**(undefined8 **)this)(this);
      pcVar9 = "+++ OK, failed as expected. ";
      if (bVar2 != 0) {
        pcVar9 = "*** Failed! ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)prop,pcVar9,(ulong)(bVar2 ^ 1) << 4 | 0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)prop,"Starting shrinking...",0x15);
      std::ostream::flush();
      local_1450 = (pointer)0x0;
      detail::
      doShrink<std::array<bool,5ul>,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
                ((detail *)local_14a8,
                 (Property<std::array<bool,_5UL>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                  *)this,&local_1440,local_13c8,(ostream *)prop);
      local_1450 = (pointer)local_14a8._0_8_;
      local_1440.super__Tuple_impl<0UL,_std::array<bool,_5UL>_>.
      super__Head_base<0UL,_std::array<bool,_5UL>,_false>._M_head_impl._M_elems[0] =
           (bool)local_14a8[8];
      local_1440.super__Tuple_impl<0UL,_std::array<bool,_5UL>_>.
      super__Head_base<0UL,_std::array<bool,_5UL>,_false>._M_head_impl._M_elems[1] =
           (bool)local_14a8[9];
      local_1440.super__Tuple_impl<0UL,_std::array<bool,_5UL>_>.
      super__Head_base<0UL,_std::array<bool,_5UL>,_false>._M_head_impl._M_elems[2] =
           (bool)local_14a8[10];
      local_1440.super__Tuple_impl<0UL,_std::array<bool,_5UL>_>.
      super__Head_base<0UL,_std::array<bool,_5UL>,_false>._M_head_impl._M_elems[3] =
           (bool)local_14a8[0xb];
      local_1440.super__Tuple_impl<0UL,_std::array<bool,_5UL>_>.
      super__Head_base<0UL,_std::array<bool,_5UL>,_false>._M_head_impl._M_elems[4] =
           (bool)local_14a8[0xc];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,"done\n",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,"Falsifiable after ",0x12);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)prop);
      pcVar9 = " tests";
      if (numSuccess == (ostream *)0x0) {
        pcVar9 = " test";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,pcVar9,(ulong)(numSuccess != (ostream *)0x0) + 5);
      if (local_1450 != (pointer)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop," and ",5);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)prop);
        pcVar9 = " shrinks";
        if (local_1450 == (pointer)0x1) {
          pcVar9 = " shrink";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,pcVar9,(ulong)(local_1450 != (pointer)0x1) + 7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop," for input:\n",0xc);
      printInput<std::array<bool,5ul>>((ostream *)prop,&local_1440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)prop,"(To reproduce the test, use ",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,"CPPQUICKCHECK_SEED",0x12);
      local_14a9 = '=';
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,&local_14a9,1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
      cVar3 = (*(code *)**(undefined8 **)this)(this);
      poVar4 = local_1458;
      if (cVar3 == '\0') {
        (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_1468;
        (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_1468;
        (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_1478->result = QC_SUCCESS;
        local_1478->numTests = (size_t)(numSuccess + 1);
        local_14a8._8_4_ = _S_red;
        local_14a8._16_8_ = (_Base_ptr)0x0;
        local_14a8._24_8_ = local_14a8 + 8;
        local_1480 = 0;
        p_Var8 = local_1400._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Stack_1488 = (_Base_ptr)local_14a8._24_8_;
        if ((_Rb_tree_header *)local_1400._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_1400._M_impl.super__Rb_tree_header) {
          do {
            local_1438 = *(undefined1 (*) [8])(p_Var8 + 2);
            local_1430._M_p = local_1420;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1430,*(long *)(p_Var8 + 1),
                       (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
            std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
            ::_M_emplace_equal<std::pair<unsigned_long,std::__cxx11::string>>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                        *)local_14a8,
                       (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1438);
            if (local_1430._M_p != local_1420) {
              operator_delete(local_1430._M_p);
            }
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
          } while ((_Rb_tree_header *)p_Var8 != &local_1400._M_impl.super__Rb_tree_header);
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear(&local_1460->_M_t);
        pRVar1 = local_1478;
        if ((_Base_ptr)local_14a8._16_8_ != (_Base_ptr)0x0) {
          (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_14a8._8_4_;
          (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)local_14a8._16_8_;
          (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)local_14a8._24_8_;
          (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_1488;
          *(_Base_ptr *)(local_14a8._16_8_ + 8) = local_1468;
          (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_1480;
          local_14a8._16_8_ = (_Base_ptr)0x0;
          local_14a8._24_8_ = local_14a8 + 8;
          local_1480 = 0;
          p_Stack_1488 = (_Base_ptr)local_14a8._24_8_;
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_14a8);
        pRVar1->seed = local_1470;
      }
      else {
        while (pcVar9 = getenv("CPPQUICKCHECK_LOOP_FAILING_TESTS"), pcVar9 != (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)prop,"Looping failing test...\n",0x18);
          (**(code **)(*(long *)this + 0x30))(this,&local_1440);
        }
        (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_1468;
        (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_1468;
        (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_1478->result = QC_FAILURE;
        local_1478->numTests = (size_t)(numSuccess + 1);
        local_14a8._8_4_ = _S_red;
        local_14a8._16_8_ = (_Base_ptr)0x0;
        local_14a8._24_8_ = local_14a8 + 8;
        local_1480 = 0;
        p_Stack_1488 = (_Base_ptr)local_14a8._24_8_;
        for (p_Var8 = local_1400._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != &local_1400._M_impl.super__Rb_tree_header;
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
          local_1438 = *(undefined1 (*) [8])(p_Var8 + 2);
          local_1430._M_p = local_1420;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1430,*(long *)(p_Var8 + 1),
                     (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
          ::_M_emplace_equal<std::pair<unsigned_long,std::__cxx11::string>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                      *)local_14a8,
                     (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1438);
          if (local_1430._M_p != local_1420) {
            operator_delete(local_1430._M_p);
          }
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear(&local_1460->_M_t);
        pRVar1 = local_1478;
        if ((_Base_ptr)local_14a8._16_8_ != (_Base_ptr)0x0) {
          (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_14a8._8_4_;
          (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)local_14a8._16_8_;
          (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)local_14a8._24_8_;
          (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_1488;
          *(_Base_ptr *)(local_14a8._16_8_ + 8) = local_1468;
          (local_1478->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_1480;
          local_14a8._16_8_ = (_Base_ptr)0x0;
          local_14a8._24_8_ = local_14a8 + 8;
          local_1480 = 0;
          p_Stack_1488 = (_Base_ptr)local_14a8._24_8_;
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_14a8);
        pRVar1->seed = local_1470;
        pRVar1->numShrinks = (size_t)local_1450;
        pRVar1->usedSize = uVar6;
        poVar4 = local_1458;
      }
      cVar3 = (char)local_146c;
    }
    else {
      numSuccess = numSuccess + 1;
      poVar4 = local_1458;
    }
    if (cVar3 == '\0') goto LAB_0010d122;
  }
  local_14a8._8_4_ = _S_red;
  local_14a8._16_8_ = (_Base_ptr)0x0;
  local_14a8._24_8_ = local_14a8 + 8;
  local_1480 = 0;
  p_Stack_1488 = (_Base_ptr)local_14a8._24_8_;
  if ((_Rb_tree_header *)local_1400._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_1400._M_impl.super__Rb_tree_header) {
    p_Var8 = local_1400._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_1438 = *(undefined1 (*) [8])(p_Var8 + 2);
      local_1430._M_p = local_1420;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1430,*(long *)(p_Var8 + 1),
                 (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::pair<unsigned_long,std::__cxx11::string>>
                ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                  *)local_14a8,
                 (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1438);
      if (local_1430._M_p != local_1420) {
        operator_delete(local_1430._M_p);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != &local_1400._M_impl.super__Rb_tree_header);
  }
  cVar3 = (*(code *)**(undefined8 **)this)(this);
  lVar5 = local_1408;
  this_00 = local_1460;
  pRVar1 = local_1478;
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)prop,"*** Failed! Expected failure but passed ",0x28);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)prop);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," tests",6);
    if (lVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop," (",2);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)prop);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% trivial)",10);
    }
    local_1438[0] = 0x2e;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,local_1438,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    detail::outputLabels
              ((ostream *)prop,(size_t)numSuccess,
               (multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_14a8);
    (pRVar1->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pRVar1->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pRVar1->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_1468;
    (pRVar1->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_1468;
    (pRVar1->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pRVar1->result = QC_NO_EXPECTED_FAILURE;
    pRVar1->numTests = (size_t)numSuccess;
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&this_00->_M_t,
                (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_14a8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,"+++ OK, passed ",0xf);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)prop);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," tests",6);
    if (lVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop," (",2);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)prop);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% trivial)",10);
    }
    local_1438[0] = 0x2e;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,local_1438,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    detail::outputLabels
              ((ostream *)prop,(size_t)numSuccess,
               (multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_14a8);
    (pRVar1->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pRVar1->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pRVar1->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_1468;
    (pRVar1->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_1468;
    (pRVar1->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pRVar1->result = QC_SUCCESS;
    pRVar1->numTests = (size_t)numSuccess;
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&this_00->_M_t,
                (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_14a8);
  }
  pRVar1->seed = local_1470;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_14a8);
LAB_0010d122:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_1400);
  return local_1478;
}

Assistant:

Result quickCheckOutput(
    const Property<T0, T1, T2, T3, T4>& prop,
    std::ostream& out = std::cout,
    std::size_t maxSuccess = 100,
    std::size_t maxDiscarded = 0,
    std::size_t maxSize = 0,
    std::chrono::duration<double> shrinkTimeout = DEFAULT_SHRINK_TIMEOUT,
    SeedType seed = USE_DEFAULT_SEED) {
  using Input = typename Property<T0, T1, T2, T3, T4>::Input;

  out << "* Checking property \"" << prop.name() << "\" ..." << std::endl;

  if (maxDiscarded == 0)
    maxDiscarded = maxSuccess * 5;
  if (maxSize == 0)
    maxSize = 100;

  std::map<std::string, std::size_t> labelsCollected;
  std::size_t numSuccess = 0, numDiscarded = 0, numTrivial = 0;

  seed = detail::resolveSeed(seed);
  RngEngine rng{seed};
  while (numSuccess < maxSuccess) {
    std::size_t size = (numSuccess * maxSize + numDiscarded) / maxSuccess;
    Input in = prop.generateInput(rng, size);
    try {
      bool success = false;
      try {
        success = prop.checkInput(in);
      } catch (...) {
        out << "Caught exception checking property...\n";
      }

      if (prop.trivialInput(in))
        ++numTrivial;
      ++labelsCollected[prop.classifyInput(in)];

      if (success) {
        ++numSuccess;
      } else {
        if (prop.expect()) {
          out << "*** Failed! ";
        } else {
          out << "+++ OK, failed as expected. ";
        }

        std::size_t numShrinks = 0;
        try {
          out << "Starting shrinking..." << std::flush;
          std::pair<std::size_t, Input> shrinkRes =
              detail::doShrink(prop, in, shrinkTimeout, out);
          numShrinks = shrinkRes.first;
          in = shrinkRes.second;
          out << "done\n";
        } catch (...) {
          out << "WARN: Aborted shrinking because an exception was thrown\n";
        }
        out << "Falsifiable after " << numSuccess + 1
            << (numSuccess == 0 ? " test" : " tests");
        if (numShrinks > 0) {
          out << " and " << numShrinks
              << (numShrinks == 1 ? " shrink" : " shrinks");
        }
        out << " for input:\n";
        printInput(out, in);
        out << "(To reproduce the test, use " << CPPQUICKCHECK_SEED_ENV << '='
            << seed << ")\n";

        if (prop.expect()) {
          while (getenv(CPPQUICKCHECK_LOOP_FAILING_TESTS_ENV) != nullptr) {
            out << "Looping failing test...\n";
            prop.checkInput(in);
          }
          Result ret;
          ret.result = QC_FAILURE;
          ret.numTests = numSuccess + 1;
          ret.labels = detail::convertLabels(labelsCollected);
          ret.seed = seed;
          ret.numShrinks = numShrinks;
          ret.usedSize = size;
          return ret;
        } else {
          Result ret;
          ret.result = QC_SUCCESS;
          ret.numTests = numSuccess + 1;
          ret.labels = detail::convertLabels(labelsCollected);
          ret.seed = seed;
          return ret;
        }
      }
    } catch (...) {
      if (++numDiscarded >= maxDiscarded) {
        out << "*** Gave up! Passed only " << numSuccess << " tests."
            << std::endl;

        Result ret;
        ret.result = QC_GAVE_UP;
        ret.numTests = numSuccess;
        ret.labels = detail::convertLabels(labelsCollected);
        ret.seed = seed;
        return ret;
      }
    }
  }

  std::multimap<std::size_t, std::string> labels =
      detail::convertLabels(labelsCollected);

  if (prop.expect()) {
    out << "+++ OK, passed " << numSuccess << " tests";
    if (numTrivial != 0)
      out << " (" << (100 * numTrivial / numSuccess) << "% trivial)";
    out << '.' << std::endl;
    detail::outputLabels(out, numSuccess, labels);

    Result ret;
    ret.result = QC_SUCCESS;
    ret.numTests = numSuccess;
    ret.labels = labels;
    ret.seed = seed;
    return ret;
  } else {
    out << "*** Failed! Expected failure but passed " << numSuccess << " tests";
    if (numTrivial != 0)
      out << " (" << (100 * numTrivial / numSuccess) << "% trivial)";
    out << '.' << std::endl;
    detail::outputLabels(out, numSuccess, labels);

    Result ret;
    ret.result = QC_NO_EXPECTED_FAILURE;
    ret.numTests = numSuccess;
    ret.labels = labels;
    ret.seed = seed;
    return ret;
  }
}